

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

IPGMContext * __thiscall
r_exec::IPGMContext::getChild(IPGMContext *__return_storage_ptr__,IPGMContext *this,uint16_t index)

{
  uint16_t uVar1;
  Code *pCVar2;
  Atom *pAVar3;
  long lVar4;
  _Hash_node_base _Var5;
  uint uVar6;
  pointer pcVar7;
  __node_base *p_Var8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  switch((this->super__Context).data) {
  case STEM:
    uVar1 = (this->super__Context).index;
    pAVar3 = (this->super__Context).code;
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar3;
    (__return_storage_ptr__->super__Context).index = index + uVar1;
    (__return_storage_ptr__->super__Context).data = STEM;
    break;
  case REFERENCE:
    uVar1 = (this->super__Context).index;
    pAVar3 = (this->super__Context).code;
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar3;
    (__return_storage_ptr__->super__Context).index = index + uVar1;
    (__return_storage_ptr__->super__Context).data = REFERENCE;
    break;
  case VIEW:
    uVar1 = (this->super__Context).index;
    pAVar3 = (this->super__Context).code;
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = pAVar3;
    (__return_storage_ptr__->super__Context).index = index + uVar1;
    (__return_storage_ptr__->super__Context).data = VIEW;
    break;
  case MKS:
    (*(this->object->super__Object)._vptr__Object[0x13])();
    pCVar2 = this->object;
    pcVar7 = (pointer)&(pCVar2->markers).used_cells_head;
    uVar6 = 0;
    while( true ) {
      lVar4 = pcVar7->next;
      if ((int)(index - 1) <= (int)(uVar6 & 0xffff)) {
        (*(pCVar2->super__Object)._vptr__Object[0x14])(pCVar2);
        IPGMContext(__return_storage_ptr__,
                    (pCVar2->markers).cells.
                    super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar4].data,0);
        return __return_storage_ptr__;
      }
      if (lVar4 == -1) break;
      uVar6 = uVar6 + 1;
      pcVar7 = (pCVar2->markers).cells.
               super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar4;
    }
    (*(pCVar2->super__Object)._vptr__Object[0x14])(pCVar2);
  default:
switchD_001743aa_default:
    (__return_storage_ptr__->super__Context).index = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)0x0;
    (__return_storage_ptr__->super__Context).data = UNDEFINED;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001d0488;
    goto LAB_00174549;
  case VWS:
    (*(this->object->super__Object)._vptr__Object[0x11])();
    pCVar2 = this->object;
    p_Var8 = &(pCVar2->views)._M_h._M_before_begin;
    uVar6 = 0;
    do {
      p_Var8 = p_Var8->_M_nxt;
      if ((int)(index - 1) <= (int)(uVar6 & 0xffff)) {
        (*(pCVar2->super__Object)._vptr__Object[0x12])();
        pCVar2 = this->object;
        _Var5._M_nxt = p_Var8[1]._M_nxt;
        uVar1 = (this->super__Context).index;
        (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
        (__return_storage_ptr__->super__Context).code = (Atom *)(_Var5._M_nxt + 5);
        (__return_storage_ptr__->super__Context).index = index + uVar1;
        (__return_storage_ptr__->super__Context).data = VIEW;
        (__return_storage_ptr__->super__Context)._vptr__Context =
             (_func_int **)&PTR___Context_001d0488;
        __return_storage_ptr__->object = pCVar2;
        __return_storage_ptr__->view = (View *)_Var5._M_nxt;
        return __return_storage_ptr__;
      }
      uVar6 = uVar6 + 1;
    } while (p_Var8 != (__node_base *)0x0);
    (*(pCVar2->super__Object)._vptr__Object[0x12])();
    goto switchD_001743aa_default;
  case VALUE_ARRAY:
    uVar1 = (this->super__Context).index;
    pAVar3 = (this->super__Context).code;
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar3;
    (__return_storage_ptr__->super__Context).index = index + uVar1;
    (__return_storage_ptr__->super__Context).data = VALUE_ARRAY;
  }
  (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001d0488;
  uVar9 = *(undefined4 *)&this->object;
  uVar10 = *(undefined4 *)((long)&this->object + 4);
  uVar11 = *(undefined4 *)&this->view;
  uVar12 = *(undefined4 *)((long)&this->view + 4);
LAB_00174549:
  *(undefined4 *)&__return_storage_ptr__->object = uVar9;
  *(undefined4 *)((long)&__return_storage_ptr__->object + 4) = uVar10;
  *(undefined4 *)&__return_storage_ptr__->view = uVar11;
  *(undefined4 *)((long)&__return_storage_ptr__->view + 4) = uVar12;
  return __return_storage_ptr__;
}

Assistant:

IPGMContext getChild(uint16_t index) const
    {
        switch (data) {
        case STEM:
            return IPGMContext(object, view, code, this->index + index, (InputLessPGMOverlay *)overlay, STEM);

        case REFERENCE:
            return IPGMContext(object, view, code, this->index + index, (InputLessPGMOverlay *)overlay, REFERENCE);

        case VIEW:
            return IPGMContext(object, view, code, this->index + index, NULL, VIEW);

        case MKS: {
            uint16_t i = 0;
            r_code::list<Code *>::const_iterator m;
            object->acq_markers();

            for (m = object->markers.begin(); i < index - 1; ++i, ++m) {
                if (m == object->markers.end()) { // happens when the list has changed after the call to getChildrenCount.
                    object->rel_markers();
                    return IPGMContext();
                }
            }

            object->rel_markers();
            return IPGMContext(*m, 0);
        }

        case VWS: {
            uint16_t i = 0;
            std::unordered_set<r_code::View *, r_code::View::Hash, r_code::View::Equal>::const_iterator v;
            object->acq_views();

            for (v = object->views.begin(); i < index - 1; ++i, ++v) {
                if (v == object->views.end()) { // happens when the list has changed after the call to getChildrenCount.
                    object->rel_views();
                    return IPGMContext();
                }
            }

            object->rel_views();
            return IPGMContext(object, (r_exec::View*)*v, &(*v)->code(0), this->index + index, NULL, VIEW);
        }

        case VALUE_ARRAY:
            return IPGMContext(object, view, code, this->index + index, (InputLessPGMOverlay *)overlay, VALUE_ARRAY);

        default: // undefined context.
            return IPGMContext();
        }
    }